

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  byte bVar1;
  int iVar2;
  Extension *pEVar3;
  LogMessage *pLVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar6;
  LogFinisher local_61;
  LogMessage local_60;
  MessageLite *pMVar5;
  
  pVar6 = Insert(this,number);
  pEVar3 = pVar6.first;
  pEVar3->descriptor = descriptor;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar3->is_repeated != false) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x28f);
      pLVar4 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    bVar1 = pEVar3->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar4 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x28f);
      pLVar4 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    bVar1 = pEVar3->field_0xa;
    pEVar3->field_0xa = bVar1 & 0xf0;
    pMVar5 = (pEVar3->field_0).message_value;
    if ((bVar1 & 0x10) != 0) {
      iVar2 = (*pMVar5->_vptr_MessageLite[4])(pMVar5,prototype,this->arena_);
      pMVar5 = (MessageLite *)CONCAT44(extraout_var_00,iVar2);
    }
  }
  else {
    pEVar3->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar4 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 10) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x288);
      pLVar4 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    pEVar3->is_repeated = false;
    pEVar3->field_0xa = pEVar3->field_0xa & 0xf;
    iVar2 = (*prototype->_vptr_MessageLite[3])(prototype,this->arena_);
    pMVar5 = (MessageLite *)CONCAT44(extraout_var,iVar2);
    (pEVar3->field_0).int64_t_value = (int64_t)pMVar5;
    pEVar3->field_0xa = pEVar3->field_0xa & 0xf0;
  }
  return pMVar5;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(int number, FieldType type,
                                          const MessageLite& prototype,
                                          const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = prototype.New(arena_);
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(prototype, arena_);
    } else {
      return extension->message_value;
    }
  }
}